

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnklog.cpp
# Opt level: O2

void gnilk::Logger::EnableAllLoggers(void)

{
  LogManager *pLVar1;
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  pLVar1 = LogManager::Instance();
  local_28._M_unused._M_object = (void *)0x0;
  local_28._8_8_ = 0;
  local_10 = std::
             _Function_handler<bool_(const_std::shared_ptr<gnilk::Log>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/ext/gnklog/src/gnklog.cpp:54:40)>
             ::_M_invoke;
  local_18 = std::
             _Function_handler<bool_(const_std::shared_ptr<gnilk::Log>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/ext/gnklog/src/gnklog.cpp:54:40)>
             ::_M_manager;
  LogManager::IterateLogs(pLVar1,(LogDelegate *)&local_28);
  std::_Function_base::~_Function_base((_Function_base *)&local_28);
  pLVar1 = LogManager::Instance();
  pLVar1->enableLogOnCreate = true;
  return;
}

Assistant:

void Logger::EnableAllLoggers() {
    LogManager::Instance().IterateLogs([](const Log::Ref &log) {
       log->SetEnabled(true);
       return true;
    });
    LogManager::Instance().SetEnableLogOnCreate(true);
}